

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagExtracter::acceptTag(TagExtracter *this,string *tag)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Catch local_38 [32];
  string *local_18;
  string *tag_local;
  TagExtracter *this_local;
  
  this_00 = this->m_tags;
  local_18 = tag;
  tag_local = (string *)this;
  toLower(local_38,tag);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(this_00,(value_type *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

virtual void acceptTag( std::string const& tag ) {
            m_tags.insert( toLower( tag ) );
        }